

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall Lists<int_*>::clear(Lists<int_*> *this)

{
  shared_ptr<ListNodes<int_*>_> local_30;
  shared_ptr<ListNodes<int_*>_> local_20;
  Lists<int_*> *local_10;
  Lists<int_*> *this_local;
  
  local_10 = this;
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<int_*>_>::operator=(&this->theHead,&local_20);
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(&local_20);
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<int_*>_>::operator=(&this->theLast,&local_30);
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(&local_30);
  this->theSize = 0;
  return;
}

Assistant:

void Lists<T>::clear() {
    theHead = nullptr;
    theLast = nullptr;
    theSize = 0;
}